

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

string * fs_trim_abi_cxx11_(string *__return_storage_ptr__,string_view s)

{
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,s._M_str,s._M_str + s._M_len);
  lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_trim(std::string_view s)
{
  // trim trailing nulls
  std::string r(s);
  if(auto i = r.find('\0'); i != std::string::npos)
    r.resize(i);

  return r;
}